

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void sync_write(AV1LfSync *lf_sync,int r,int c,int sb_cols,int plane)

{
  int iVar1;
  
  if (c < sb_cols + -1) {
    if (c % lf_sync->sync_range != 0) {
      return;
    }
  }
  else {
    c = lf_sync->sync_range + sb_cols;
  }
  pthread_mutex_lock((pthread_mutex_t *)(lf_sync->mutex_[plane] + r));
  iVar1 = lf_sync->cur_sb_col[plane][r];
  if (c < iVar1) {
    c = iVar1;
  }
  lf_sync->cur_sb_col[plane][r] = c;
  pthread_cond_broadcast((pthread_cond_t *)(lf_sync->cond_[plane] + r));
  pthread_mutex_unlock((pthread_mutex_t *)(lf_sync->mutex_[plane] + r));
  return;
}

Assistant:

static inline void sync_write(AV1DecRowMTSync *const dec_row_mt_sync, int r,
                              int c, const int sb_cols) {
#if CONFIG_MULTITHREAD
  const int nsync = dec_row_mt_sync->sync_range;
  int cur;
  int sig = 1;

  if (c < sb_cols - 1) {
    cur = c;
    if (c % nsync) sig = 0;
  } else {
    cur = sb_cols + nsync + dec_row_mt_sync->intrabc_extra_top_right_sb_delay;
  }

  if (sig) {
    pthread_mutex_lock(&dec_row_mt_sync->mutex_[r]);

    dec_row_mt_sync->cur_sb_col[r] = cur;

    pthread_cond_signal(&dec_row_mt_sync->cond_[r]);
    pthread_mutex_unlock(&dec_row_mt_sync->mutex_[r]);
  }
#else
  (void)dec_row_mt_sync;
  (void)r;
  (void)c;
  (void)sb_cols;
#endif  // CONFIG_MULTITHREAD
}